

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void dma_synchronize(Emulator *e)

{
  Ticks TVar1;
  Ticks TVar2;
  u8 value;
  ulong uVar3;
  MemoryTypeAddressPair pair;
  Bool raw;
  ulong uVar4;
  long lVar5;
  
  if ((e->state).dma.state != DMA_INACTIVE) {
    uVar3 = (e->state).dma.sync_ticks;
    uVar4 = (e->state).ticks;
    lVar5 = uVar3 - uVar4;
    if (uVar3 < uVar4) {
      (e->state).dma.sync_ticks = uVar4;
      TVar1 = (e->state).cpu_tick;
      for (; lVar5 != 0; lVar5 = lVar5 + TVar1) {
        uVar3 = (e->state).dma.tick_count;
        if (uVar3 < 8) {
          (e->state).dma.tick_count = uVar3 + 4;
          if (3 < uVar3) {
            (e->state).dma.tick_count = 8;
            (e->state).dma.state = DMA_ACTIVE;
          }
        }
        else {
          uVar4 = uVar3 + 0x3f8 >> 2;
          uVar3 = uVar4 & 0xff;
          if (0x9f < (uint)uVar3) {
            __assert_fail("addr_offset < OAM_TRANSFER_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                          ,0xf80,"void dma_synchronize(Emulator *)");
          }
          pair = map_address((short)uVar3 + (e->state).dma.source);
          value = read_u8_pair(e,pair,raw);
          write_oam_no_mode_check(e,(ushort)uVar4 & 0xff,value);
          TVar2 = (e->state).dma.tick_count;
          uVar3 = TVar2 + 4;
          uVar4 = TVar2 - 0x284;
          if (0x287 >= uVar3) {
            uVar4 = uVar3;
          }
          (e->state).dma.tick_count = uVar4;
          if (0x287 < uVar3) {
            (e->state).dma.state = DMA_INACTIVE;
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void dma_synchronize(Emulator* e) {
  if (UNLIKELY(DMA.state != DMA_INACTIVE)) {
    if (TICKS > DMA.sync_ticks) {
      Ticks delta_ticks = TICKS - DMA.sync_ticks;
      DMA.sync_ticks = TICKS;

      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        if (DMA.tick_count < DMA_DELAY_TICKS) {
          DMA.tick_count += CPU_TICK;
          if (DMA.tick_count >= DMA_DELAY_TICKS) {
            DMA.tick_count = DMA_DELAY_TICKS;
            DMA.state = DMA_ACTIVE;
          }
          continue;
        }

        u8 addr_offset = (DMA.tick_count - DMA_DELAY_TICKS) >> 2;
        assert(addr_offset < OAM_TRANSFER_SIZE);
        u8 value =
            read_u8_pair(e, map_address(DMA.source + addr_offset), FALSE);
        write_oam_no_mode_check(e, addr_offset, value);
        DMA.tick_count += CPU_TICK;
        if (VALUE_WRAPPED(DMA.tick_count, DMA_TICKS)) {
          DMA.state = DMA_INACTIVE;
          break;
        }
      }
    }
  }
}